

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOutputFile.cpp
# Opt level: O3

void __thiscall Imf_3_4::OutputFile::~OutputFile(OutputFile *this)

{
  pthread_mutex_t *__mutex;
  OStream *pOVar1;
  int iVar2;
  undefined4 extraout_var;
  Data *this_00;
  
  (this->super_GenericOutputFile)._vptr_GenericOutputFile = (_func_int **)&PTR__OutputFile_001e3d98;
  if (this->_data == (Data *)0x0) goto LAB_00194444;
  __mutex = (pthread_mutex_t *)this->_data->_streamData;
  iVar2 = pthread_mutex_lock(__mutex);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  iVar2 = (*this->_data->_streamData->os->_vptr_OStream[3])();
  if (this->_data->lineOffsetsPosition != 0) {
    (*this->_data->_streamData->os->_vptr_OStream[4])();
    anon_unknown_7::writeLineOffsets(this->_data->_streamData->os,&this->_data->lineOffsets);
    pOVar1 = this->_data->_streamData->os;
    (*pOVar1->_vptr_OStream[4])(pOVar1,CONCAT44(extraout_var,iVar2));
  }
  pthread_mutex_unlock(__mutex);
  this_00 = this->_data;
  if (((this_00->_deleteStream == true) && (this_00->_streamData != (OutputStreamMutex *)0x0)) &&
     (pOVar1 = this_00->_streamData->os, pOVar1 != (OStream *)0x0)) {
    (*pOVar1->_vptr_OStream[1])();
    this_00 = this->_data;
  }
  if ((this_00->partNumber == -1) && (this_00->_streamData != (OutputStreamMutex *)0x0)) {
    operator_delete(this_00->_streamData,0x38);
    this_00 = this->_data;
    if (this_00 != (Data *)0x0) goto LAB_0019442f;
    this_00 = (Data *)0x0;
  }
  else {
LAB_0019442f:
    Data::~Data(this_00);
  }
  operator_delete(this_00,0x148);
LAB_00194444:
  GenericOutputFile::~GenericOutputFile(&this->super_GenericOutputFile);
  return;
}

Assistant:

OutputFile::~OutputFile ()
{
    if (_data)
    {
        {
#if ILMTHREAD_THREADING_ENABLED
            std::lock_guard<std::mutex> lock (*_data->_streamData);
#endif
            uint64_t originalPosition = _data->_streamData->os->tellp ();

            if (_data->lineOffsetsPosition > 0)
            {
                try
                {
                    _data->_streamData->os->seekp (_data->lineOffsetsPosition);
                    writeLineOffsets (
                        *_data->_streamData->os, _data->lineOffsets);

                    //
                    // Restore the original position.
                    //
                    _data->_streamData->os->seekp (originalPosition);
                }
                catch (
                    ...) //NOSONAR - suppress vulnerability reports from SonarCloud.
                {
                    //
                    // We cannot safely throw any exceptions from here.
                    // This destructor may have been called because the
                    // stack is currently being unwound for another
                    // exception.
                    //
                }
            }
        }

        if (_data->_deleteStream && _data->_streamData)
            delete _data->_streamData->os;

        if (_data->partNumber == -1 && _data->_streamData)
            delete _data->_streamData;

        delete _data;
    }
}